

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  byte bVar1;
  int B;
  OpCode o;
  int iVar2;
  
  luaK_exp2anyreg(fs,e);
  B = (e->u).info;
  freeexp(fs,e);
  bVar1 = fs->freereg;
  (e->u).info = (uint)bVar1;
  e->k = VNONRELOC;
  luaK_reserveregs(fs,2);
  if (-1 < ((key->u).strval)->shrlen) {
    iVar2 = luaK_exp2K(fs,key);
    if (iVar2 != 0) {
      o = OP_SELF;
      goto LAB_00121d4b;
    }
  }
  luaK_exp2anyreg(fs,key);
  luaK_code(fs,(uint)bVar1 * 0x80 + B * 0x10000 + 0x80);
  o = OP_GETTABLE;
LAB_00121d4b:
  luaK_codeABCk(fs,o,(uint)bVar1,B,(key->u).info,0);
  freeexp(fs,key);
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int ereg, base;
  luaK_exp2anyreg(fs, e);
  ereg = e->u.info;  /* register where 'e' (the receiver) was placed */
  freeexp(fs, e);
  base = e->u.info = fs->freereg;  /* base register for op_self */
  e->k = VNONRELOC;  /* self expression has a fixed register */
  luaK_reserveregs(fs, 2);  /* method and 'self' produced by op_self */
  lua_assert(key->k == VKSTR);
  /* is method name a short string in a valid K index? */
  if (strisshr(key->u.strval) && luaK_exp2K(fs, key)) {
    /* can use 'self' opcode */
    luaK_codeABCk(fs, OP_SELF, base, ereg, key->u.info, 0);
  }
  else {  /* cannot use 'self' opcode; use move+gettable */
    luaK_exp2anyreg(fs, key);  /* put method name in a register */
    luaK_codeABC(fs, OP_MOVE, base + 1, ereg, 0);  /* copy self to base+1 */
    luaK_codeABC(fs, OP_GETTABLE, base, ereg, key->u.info);  /* get method */
  }
  freeexp(fs, key);
}